

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

void __thiscall
kj::StringTree::
fill<kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,StringTree *rest,
          StringTree *rest_1,ArrayPtr<const_char> *rest_2,ArrayPtr<const_char> *rest_3,
          ArrayPtr<const_char> *rest_4,String *rest_5,ArrayPtr<const_char> *rest_6,String *rest_7,
          ArrayPtr<const_char> *rest_8,ArrayPtr<const_char> *rest_9,ArrayPtr<const_char> *rest_10,
          StringTree *rest_11,ArrayPtr<const_char> *rest_12)

{
  Branch *pBVar1;
  char *pcVar2;
  
  pcVar2 = (char *)(this->text).content.size_;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = (this->text).content.ptr;
  }
  pBVar1 = (this->branches).ptr + branchIndex;
  pBVar1->index = (long)pos - (long)pcVar2;
  operator=(&pBVar1->content,first);
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,
             rest_9,rest_10,rest_11,rest_12);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}